

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O0

void __thiscall
WSNTopologyBasedEnergy::WSNTopologyBasedEnergy(WSNTopologyBasedEnergy *this,TransportType type)

{
  WSNNode *local_188;
  vector<WSNNode,_std::allocator<WSNNode>_> *local_168;
  vector<WSNNode,_std::allocator<WSNNode>_> *local_148;
  WSNNode *local_128;
  WSNNode *local_108;
  int local_e4;
  int i;
  Scalar_<double> local_a8;
  Mat local_88 [116];
  TransportType local_14;
  WSNTopologyBasedEnergy *pWStack_10;
  TransportType type_local;
  WSNTopologyBasedEnergy *this_local;
  
  local_14 = type;
  pWStack_10 = this;
  cv::Mat::Mat(&this->img);
  WSNNode::WSNNode(&this->sink);
  local_108 = this->node;
  do {
    WSNNode::WSNNode(local_108);
    local_108 = local_108 + 1;
  } while (local_108 != this->LayerFirstLinkNode);
  local_128 = this->LayerFirstLinkNode;
  do {
    WSNNode::WSNNode(local_128);
    local_128 = local_128 + 1;
  } while (local_128 != (WSNNode *)this->layer);
  local_148 = this->layer;
  do {
    std::vector<WSNNode,_std::allocator<WSNNode>_>::vector(local_148);
    local_148 = local_148 + 1;
  } while (local_148 != this->LayerLeaderSeq);
  local_168 = this->LayerLeaderSeq;
  do {
    std::vector<WSNNode,_std::allocator<WSNNode>_>::vector(local_168);
    local_168 = local_168 + 1;
  } while ((WSNNode *)local_168 != this->LayerLeaderNode);
  local_188 = this->LayerLeaderNode;
  do {
    WSNNode::WSNNode(local_188);
    local_188 = local_188 + 1;
  } while ((WSNTopologyBasedEnergy *)local_188 != this + 1);
  this->type_ = (undefined1)local_14;
  cv::Scalar_<double>::Scalar_(&local_a8,255.0,255.0,255.0,0.0);
  cv::Mat::Mat(local_88,600,600,0x10,(Scalar_ *)&local_a8);
  cv::Mat::operator=(&this->img,local_88);
  cv::Mat::~Mat(local_88);
  this->Test = true;
  WSNNode::WSNNode((WSNNode *)&stack0xffffffffffffff20,0,0);
  WSNNode::operator=(&this->sink,(WSNNode *)&stack0xffffffffffffff20);
  WSNNode::~WSNNode((WSNNode *)&stack0xffffffffffffff20);
  this->alpha = 1.4e-05;
  this->TopLayer = 0;
  this->ENERGY = 100.0;
  this->NetThresEnergy = 75.0;
  for (local_e4 = 0; local_e4 < 5; local_e4 = local_e4 + 1) {
    this->Mark[local_e4] = 0;
    this->ThresEnergy[local_e4] = 75.0;
  }
  return;
}

Assistant:

WSNTopologyBasedEnergy::WSNTopologyBasedEnergy(TransportType type){
	type_ = type;
	img = Mat(600,600,CV_8UC3,Scalar(255,255,255));
	//是否测试
	Test= true;
	//汇聚节点
	sink=WSNNode(0,0);
	//能量传送系数
	alpha = 0.000014;
	//直接与sink节点通信的层号
	TopLayer=0;
	//节点能量初始值
	ENERGY=100;
	//整个网络的能力阈值
	NetThresEnergy=75;
	for(int i=0;i<LayerNum;i++){
		//标记
		Mark[i]=0;
		//每层的能量阈值
		ThresEnergy[i]=75;
	}
}